

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-atom.c
# Opt level: O2

int fy_atom_iter_utf8_quoted_get(fy_atom_iter *iter,size_t *lenp,uint8_t *buf)

{
  uint uVar1;
  int iVar2;
  ssize_t sVar3;
  ulong uVar4;
  ulong count;
  int ww;
  
  if (buf == (uint8_t *)0x0 || (lenp == (size_t *)0x0 || iter == (fy_atom_iter *)0x0)) {
    return -1;
  }
  if (*lenp < 4) {
    return -1;
  }
  uVar1 = iter->unget_c;
  if (uVar1 != 0xffffffff) {
    iter->unget_c = -1;
    *lenp = 0;
    return uVar1 & 0xff;
  }
  sVar3 = fy_atom_iter_read(iter,buf,1);
  if (sVar3 == 1) {
    uVar1 = fy_utf8_width_by_first_octet(*buf);
    if (uVar1 != 1) {
      if (uVar1 == 0) {
        *lenp = 1;
        return 0;
      }
      count = (ulong)(uVar1 - 1);
      uVar4 = fy_atom_iter_read(iter,buf + 1,count);
      if (uVar4 != count) {
        if ((long)uVar4 < (long)count && uVar4 != 0xffffffffffffffff) {
          *lenp = *lenp + uVar4;
          return 0;
        }
        return 0;
      }
    }
    iVar2 = fy_utf8_get(buf,uVar1,&ww);
    if (iVar2 < 0) {
      *lenp = (ulong)uVar1;
      return 0;
    }
    *lenp = 0;
    return iVar2;
  }
  return -1;
}

Assistant:

int fy_atom_iter_utf8_quoted_get(struct fy_atom_iter *iter, size_t *lenp, uint8_t *buf) {
    ssize_t nread;
    int c, w, ww;

    if (!iter || !lenp || !buf || *lenp < 4)
        return -1;

    /* first try the pushed ungetc */
    if (iter->unget_c != -1) {
        c = iter->unget_c;
        iter->unget_c = -1;
        *lenp = 0;
        return c & 0xff;
    }

    /* read first octet */
    nread = fy_atom_iter_read(iter, &buf[0], 1);
    if (nread != 1)
        return -1;

    /* get width from it (0 means illegal) - return it and mark it */
    w = fy_utf8_width_by_first_octet(buf[0]);
    if (!w) {
        *lenp = 1;
        return 0;
    }

    /* read the rest octets (if possible) */
    if (w > 1) {
        nread = fy_atom_iter_read(iter, buf + 1, w - 1);
        if (nread != (w - 1)) {
            if (nread != -1 && nread < (w - 1))
                *lenp += nread;
            return 0;
        }
    }

    /* and return the decoded utf8 character */
    c = fy_utf8_get(buf, w, &ww);
    if (c >= 0) {
        *lenp = 0;
        return c;
    }
    *lenp = w;
    return 0;
}